

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O2

bool __thiscall slang::ast::ASTContext::requireTimingAllowed(ASTContext *this,SourceRange range)

{
  bool bVar1;
  
  if ((((this->flags).m_bits & 0x1800) == 0) && (bVar1 = inAlwaysCombLatch(this), !bVar1)) {
    return true;
  }
  addDiag(this,(DiagCode)0x4d0008,range);
  return false;
}

Assistant:

bool ASTContext::requireTimingAllowed(SourceRange range) const {
    if (flags.has(ASTFlags::Function | ASTFlags::Final) || inAlwaysCombLatch()) {
        addDiag(diag::TimingInFuncNotAllowed, range);
        return false;
    }
    return true;
}